

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::fillWithRGBAQuads(PixelBufferAccess *dst)

{
  InternalError *this;
  int iVar1;
  int iVar2;
  int width;
  int height;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
    iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
    width = iVar2 / 2;
    height = iVar1 / 2;
    getSubregion(&local_58,dst,0,0,0,width,height,1);
    local_68.m_data[0] = 1.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    clear(&local_58,&local_68);
    iVar2 = iVar2 - width;
    getSubregion(&local_58,dst,width,0,0,iVar2,height,1);
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 1.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    clear(&local_58,&local_68);
    iVar1 = iVar1 - height;
    getSubregion(&local_58,dst,0,height,0,width,iVar1,1);
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 1.0;
    local_68.m_data[3] = 0.0;
    clear(&local_58,&local_68);
    getSubregion(&local_58,dst,width,height,0,iVar2,iVar1,1);
    local_68.m_data[0] = 0.5;
    local_68.m_data[1] = 0.5;
    local_68.m_data[2] = 0.5;
    local_68.m_data[3] = 1.0;
    clear(&local_58,&local_68);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3c8);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void fillWithRGBAQuads (const PixelBufferAccess& dst)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	int width	= dst.getWidth();
	int height	= dst.getHeight();
	int	left	= width/2;
	int top		= height/2;

	clear(getSubregion(dst, 0,		0,		0, left,		top,		1),	Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, left,	0,		0, width-left,	top,		1),	Vec4(0.0f, 1.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, 0,		top,	0, left,		height-top,	1), Vec4(0.0f, 0.0f, 1.0f, 0.0f));
	clear(getSubregion(dst, left,	top,	0, width-left,	height-top, 1), Vec4(0.5f, 0.5f, 0.5f, 1.0f));
}